

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O2

void __thiscall CGraphics_Threaded::ClipEnable(CGraphics_Threaded *this,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar3 = *(int *)&this->field_0x10;
  iVar1 = *(int *)&this->field_0x14;
  iVar7 = iVar3;
  if (x < iVar3) {
    iVar7 = x;
  }
  iVar6 = iVar1;
  if (y < iVar1) {
    iVar6 = y;
  }
  if (y < 0) {
    iVar6 = 0;
  }
  else {
    y = 0;
  }
  if (x < 0) {
    iVar7 = 0;
  }
  else {
    x = 0;
  }
  iVar5 = x + w;
  iVar4 = y + h;
  iVar2 = iVar3 - iVar7;
  if (iVar5 < iVar3 - iVar7) {
    iVar2 = iVar5;
  }
  if (iVar5 < 0) {
    iVar2 = 0;
  }
  iVar3 = iVar1 - iVar6;
  if (iVar4 < iVar1 - iVar6) {
    iVar3 = iVar4;
  }
  if (iVar4 < 0) {
    iVar3 = 0;
  }
  (this->m_State).m_ClipEnable = true;
  (this->m_State).m_ClipX = iVar7;
  (this->m_State).m_ClipY = iVar1 - (iVar6 + iVar3);
  (this->m_State).m_ClipW = iVar2;
  (this->m_State).m_ClipH = iVar3;
  return;
}

Assistant:

int ScreenWidth() const { return m_ScreenWidth; }